

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_writeOptionsDeviations(void *highs,char *filename)

{
  HighsStatus HVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,filename,&local_31);
  HVar1 = Highs::writeOptions((Highs *)highs,&local_30,true);
  std::__cxx11::string::~string((string *)&local_30);
  return HVar1;
}

Assistant:

HighsInt Highs_writeOptionsDeviations(const void* highs, const char* filename) {
  return (HighsInt)((Highs*)highs)->writeOptions(filename, true);
}